

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

double cert::sqrt(double __x)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  float relth;
  double dVar4;
  double local_20;
  double prev;
  double curr;
  float x_local;
  
  fVar2 = SUB84(__x,0);
  if ((fVar2 < 0.0) || (dVar4 = std::numeric_limits<double>::infinity(), dVar4 <= (double)fVar2)) {
    prev = std::numeric_limits<double>::quiet_NaN();
  }
  else {
    prev = (double)fVar2;
    local_20 = 0.0;
    while( true ) {
      fVar3 = std::numeric_limits<float>::epsilon();
      relth = std::numeric_limits<float>::min();
      bVar1 = nearly_equal((float)prev,(float)local_20,fVar3 * 128.0,relth);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      local_20 = prev;
      prev = (prev + (double)fVar2 / prev) * 0.5;
    }
  }
  curr._4_4_ = (float)prev;
  return (double)(ulong)(uint)curr._4_4_;
}

Assistant:

constexpr float sqrt (float x)
{
	if (0 <= x && x < std::numeric_limits<double>::infinity ())
	{
		double curr = x;
		double prev = 0;
		while (!nearly_equal (curr, prev))
		{
			prev = curr;
			curr = 0.5 * (curr + x / curr);
		}
		return curr;
	}
	else
	{
		return std::numeric_limits<double>::quiet_NaN ();
	}
}